

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers_test.cpp
# Opt level: O3

void __thiscall TypePack_Map_Test::TestBody(TypePack_Map_Test *this)

{
  return;
}

Assistant:

TEST(TypePack, Map) {
    using SetPack = typename MapType<Set, TypePack<signed int, float, double>>::type;

    static_assert(std::is_same_v<TypePack<Set<signed int>>,
                  typename TakeFirstN<1, SetPack>::type>);
    static_assert(std::is_same_v<TypePack<Set<float>>,
                  typename TakeFirstN<1, typename RemoveFirstN<1, SetPack>::type>::type>);
    static_assert(std::is_same_v<TypePack<Set<double>>,
                  typename TakeFirstN<1, typename RemoveFirstN<2, SetPack>::type>::type>);
}